

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

int Omega_h::get_max<int>(Read<int> *a)

{
  int iVar1;
  undefined1 local_70 [4];
  int r;
  type transform;
  maximum<int> op;
  promoted_t<int> init;
  IntIterator last;
  IntIterator first;
  Read<int> *a_local;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  transform.a.write_.shared_alloc_.direct_ptr._4_4_ = 0x80000000;
  transform.a.write_.shared_alloc_.direct_ptr._3_1_ = 0;
  Read<int>::Read((Read<int> *)local_70,a);
  iVar1 = transform_reduce<Omega_h::IntIterator,Omega_h::get_max<int>(Omega_h::Read<int>)::_lambda(int)_1_,int,Omega_h::maximum<int>>
                    (0,(int)(local_10 >> 2),0x80000000,(Read<int> *)local_70);
  get_max<int>(Omega_h::Read<int>)::{lambda(int)#1}::~Read((_lambda_int__1_ *)local_70);
  return iVar1;
}

Assistant:

T get_max(Read<T> a) {
  auto const first = IntIterator(0);
  auto const last = IntIterator(a.size());
  auto const init = promoted_t<T>(ArithTraits<T>::min());
  auto const op = maximum<promoted_t<T>>();
  auto transform = OMEGA_H_LAMBDA(LO i)->promoted_t<T> {
    return promoted_t<T>(a[i]);
  };
  auto const r = transform_reduce(first, last, init, op, std::move(transform));
  return static_cast<T>(r);  // see StandinTraits
}